

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

void png_build_grayscale_palette(int bit_depth,png_colorp palette)

{
  long lVar1;
  png_byte pVar2;
  png_byte *ppVar3;
  uint uVar4;
  
  if (((palette != (png_colorp)0x0) && (uVar4 = bit_depth - 1, uVar4 < 8)) &&
     ((0x8bU >> (uVar4 & 0x1f) & 1) != 0)) {
    lVar1 = *(long *)(&DAT_00140dc0 + (ulong)uVar4 * 8);
    ppVar3 = &palette->blue;
    pVar2 = '\0';
    do {
      ((png_color *)(ppVar3 + -2))->red = pVar2;
      ppVar3[-1] = pVar2;
      *ppVar3 = pVar2;
      pVar2 = pVar2 + (char)(0x1ffffff11ff55ff >> ((char)uVar4 * '\b' & 0x3fU));
      ppVar3 = ppVar3 + 3;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void PNGAPI
png_build_grayscale_palette(int bit_depth, png_colorp palette)
{
   int num_palette;
   int color_inc;
   int i;
   int v;

   png_debug(1, "in png_do_build_grayscale_palette");

   if (palette == NULL)
      return;

   switch (bit_depth)
   {
      case 1:
         num_palette = 2;
         color_inc = 0xff;
         break;

      case 2:
         num_palette = 4;
         color_inc = 0x55;
         break;

      case 4:
         num_palette = 16;
         color_inc = 0x11;
         break;

      case 8:
         num_palette = 256;
         color_inc = 1;
         break;

      default:
         num_palette = 0;
         color_inc = 0;
         break;
   }

   for (i = 0, v = 0; i < num_palette; i++, v += color_inc)
   {
      palette[i].red = (png_byte)(v & 0xff);
      palette[i].green = (png_byte)(v & 0xff);
      palette[i].blue = (png_byte)(v & 0xff);
   }
}